

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_400578::CpuIntegrationTest_simple_program_Test::
~CpuIntegrationTest_simple_program_Test(CpuIntegrationTest_simple_program_Test *this)

{
  IMos6502 *pIVar1;
  
  (this->super_CpuIntegrationTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CpuIntegrationTest_002acc20;
  pIVar1 = (this->super_CpuIntegrationTest).cpu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>
           ._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
           .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl;
  if (pIVar1 != (IMos6502 *)0x0) {
    (*(pIVar1->super_ICpu)._vptr_ICpu[1])();
  }
  (this->super_CpuIntegrationTest).cpu._M_t.
  super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>.
  super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl = (IMos6502 *)0x0;
  (this->super_CpuIntegrationTest).mmu.super_IMmu._vptr_IMmu = (_func_int **)&PTR__FakeMmu_002ace28;
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_short,_unsigned_char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_char>_>_>
  ::~_Rb_tree(&(this->super_CpuIntegrationTest).mmu.memory_._M_t);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, simple_program) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a9 01     LDA #$01
    // $0602    8d 00 04  STA $0400
    // $0605    a2 05     LDX #$05
    // $0607    8e 01 04  STX $0401
    // $060a    a0 08     LDY #$08
    // $060c    8c 02 04  STY $0402
    // $060f    00        BRK
    load_hex_dump(0x0600,
            {0xa9,
                    0x01,
                    0x8d,
                    0x00,
                    0x04,
                    0xa2,
                    0x05,
                    0x8e,
                    0x01,
                    0x04,
                    0xa0,
                    0x08,
                    0x8c,
                    0x02,
                    0x04,
                    0x00,
                    0x00}); // Needed for previous BRK dummy read
    set_reset_address(0x0600);
    set_break_address(0xDEAD);

    expected.a = 0x01;
    expected.x = 0x05;
    expected.y = 0x08;
    expected.sp =
            registers.sp - static_cast<uint8_t>(3); // PC (2 bytes) + P (1 byte)
    expected.pc = 0xDEAD;

    const int expected_cycles = 2 + 4 + 2 + 4 + 2 + 4 + 7;

    EXPECT_EQ(expected_cycles, run_until_brk());
    EXPECT_EQ(expected, registers);
    EXPECT_EQ(0x01, mmu.read_byte(0x0400));
    EXPECT_EQ(0x05, mmu.read_byte(0x0401));
    EXPECT_EQ(0x08, mmu.read_byte(0x0402));
}